

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

int __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine::init
          (shaderCollectionForSamplingRoutine *this,EVP_PKEY_CTX *ctx)

{
  samplingFunction *sampling_function;
  int iVar1;
  samplingFunction *in_RCX;
  long in_RDX;
  TextureCubeMapArraySamplingTest *pTVar2;
  TextureCubeMapArraySamplingTest *in_R8;
  samplerType *sampler_type;
  string sampling_vertex_shader_source;
  string sampling_tesselation_evaluation_shader_source;
  string sampling_tesselation_control_shader_source;
  string sampling_geometry_shader_source;
  string sampling_fragment_shader_source;
  string sampling_compute_shader_source;
  string pass_through_tesselation_control_shader_source;
  string pass_through_vertex_shader_source;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->m_sampling_function = *in_RCX;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  sampling_function = &this->m_sampling_function;
  local_130.field_2._M_local_buf[0] = '\0';
  sampler_type = (samplerType *)(in_RDX + 0x20);
  pTVar2 = (TextureCubeMapArraySamplingTest *)this;
  getPassThroughVertexShaderCode
            ((TextureCubeMapArraySamplingTest *)this,sampler_type,sampling_function,&local_50);
  getPassThroughTesselationControlShaderCode(pTVar2,sampler_type,sampling_function,&local_70);
  pTVar2 = in_R8;
  getSamplingComputeShaderCode(in_R8,sampler_type,sampling_function,&local_90);
  getSamplingFragmentShaderCode(pTVar2,sampler_type,sampling_function,&local_b0);
  getSamplingGeometryShaderCode(pTVar2,sampler_type,sampling_function,&local_d0);
  getSamplingTesselationControlShaderCode(pTVar2,sampler_type,sampling_function,&local_f0);
  pTVar2 = in_R8;
  getSamplingTesselationEvaluationShaderCode(in_R8,sampler_type,sampling_function,&local_110);
  getSamplingVertexShaderCode(pTVar2,sampler_type,sampling_function,&local_130);
  shaderDefinition::init(&this->pass_through_vertex_shader,ctx);
  shaderDefinition::init(&this->sampling_compute_shader,ctx);
  shaderDefinition::init(&this->sampling_fragment_shader,ctx);
  shaderDefinition::init(&this->sampling_vertex_shader,ctx);
  compile(in_R8,&this->pass_through_vertex_shader);
  compile(in_R8,&this->sampling_compute_shader);
  compile(in_R8,&this->sampling_fragment_shader);
  compile(in_R8,&this->sampling_vertex_shader);
  if ((in_R8->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    shaderDefinition::init(&this->pass_through_tesselation_control_shader,ctx);
    shaderDefinition::init(&this->sampling_tesselation_control_shader,ctx);
    shaderDefinition::init(&this->sampling_tesselation_evaluation_shader,ctx);
    compile(in_R8,&this->pass_through_tesselation_control_shader);
    compile(in_R8,&this->sampling_tesselation_control_shader);
    compile(in_R8,&this->sampling_tesselation_evaluation_shader);
  }
  if ((in_R8->super_TestCaseBase).m_is_geometry_shader_extension_supported == true) {
    shaderDefinition::init(&this->sampling_geometry_shader,ctx);
    compile(in_R8,&this->sampling_geometry_shader);
  }
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  iVar1 = std::__cxx11::string::~string((string *)&local_50);
  return iVar1;
}

Assistant:

void TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine::init(
	const glw::Functions& gl, const formatDefinition& format, const samplingFunction& sampling_function,
	TextureCubeMapArraySamplingTest& test)
{
	m_sampling_function = sampling_function;

	std::string pass_through_vertex_shader_source;
	std::string pass_through_tesselation_control_shader_source;
	std::string sampling_compute_shader_source;
	std::string sampling_fragment_shader_source;
	std::string sampling_geometry_shader_source;
	std::string sampling_tesselation_control_shader_source;
	std::string sampling_tesselation_evaluation_shader_source;
	std::string sampling_vertex_shader_source;

	test.getPassThroughVertexShaderCode(format.m_sampler_type, m_sampling_function, pass_through_vertex_shader_source);

	test.getPassThroughTesselationControlShaderCode(format.m_sampler_type, m_sampling_function,
													pass_through_tesselation_control_shader_source);

	test.getSamplingComputeShaderCode(format.m_sampler_type, m_sampling_function, sampling_compute_shader_source);

	test.getSamplingFragmentShaderCode(format.m_sampler_type, m_sampling_function, sampling_fragment_shader_source);

	test.getSamplingGeometryShaderCode(format.m_sampler_type, m_sampling_function, sampling_geometry_shader_source);

	test.getSamplingTesselationControlShaderCode(format.m_sampler_type, m_sampling_function,
												 sampling_tesselation_control_shader_source);

	test.getSamplingTesselationEvaluationShaderCode(format.m_sampler_type, m_sampling_function,
													sampling_tesselation_evaluation_shader_source);

	test.getSamplingVertexShaderCode(format.m_sampler_type, m_sampling_function, sampling_vertex_shader_source);

	pass_through_vertex_shader.init(gl, GL_VERTEX_SHADER, pass_through_vertex_shader_source, &test);
	sampling_compute_shader.init(gl, GL_COMPUTE_SHADER, sampling_compute_shader_source, &test);
	sampling_fragment_shader.init(gl, GL_FRAGMENT_SHADER, sampling_fragment_shader_source, &test);
	sampling_vertex_shader.init(gl, GL_VERTEX_SHADER, sampling_vertex_shader_source, &test);

	test.compile(pass_through_vertex_shader);
	test.compile(sampling_compute_shader);
	test.compile(sampling_fragment_shader);
	test.compile(sampling_vertex_shader);

	if (test.m_is_tessellation_shader_supported)
	{
		pass_through_tesselation_control_shader.init(gl, test.m_glExtTokens.TESS_CONTROL_SHADER,
													 pass_through_tesselation_control_shader_source, &test);
		sampling_tesselation_control_shader.init(gl, test.m_glExtTokens.TESS_CONTROL_SHADER,
												 sampling_tesselation_control_shader_source, &test);
		sampling_tesselation_evaluation_shader.init(gl, test.m_glExtTokens.TESS_EVALUATION_SHADER,
													sampling_tesselation_evaluation_shader_source, &test);

		test.compile(pass_through_tesselation_control_shader);
		test.compile(sampling_tesselation_control_shader);
		test.compile(sampling_tesselation_evaluation_shader);
	}

	if (test.m_is_geometry_shader_extension_supported)
	{
		sampling_geometry_shader.init(gl, test.m_glExtTokens.GEOMETRY_SHADER, sampling_geometry_shader_source, &test);

		test.compile(sampling_geometry_shader);
	}
}